

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ErrorExpected
          (WastParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *expected,char *example)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 auStack_f8 [8];
  Token token;
  char *local_88;
  char *pcStack_80;
  size_type local_78;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_70;
  WastParser *local_60;
  char *local_58;
  size_type *local_50;
  string expected_str;
  
  Consume((Token *)auStack_f8,this);
  local_50 = &expected_str._M_string_length;
  expected_str._M_dataplus._M_p = (pointer)0x0;
  expected_str._M_string_length._0_1_ = 0;
  if ((expected->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (expected->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_replace((string *)&local_50,0,0,", expected ",0xb);
    lVar2 = (long)(expected->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(expected->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    local_60 = this;
    local_58 = example;
    if (lVar2 != 0) {
      uVar3 = lVar2 >> 5;
      lVar2 = 8;
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          pcVar4 = " or ";
          if (uVar5 != uVar3 - 1) {
            pcVar4 = ", ";
          }
          std::__cxx11::string::append((string *)&local_50,pcVar4);
        }
        pbVar1 = (expected->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::_M_append
                  ((string *)&local_50,*(char **)((long)pbVar1 + lVar2 + -8),
                   *(ulong *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2));
        uVar5 = uVar5 + 1;
        uVar3 = (long)(expected->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(expected->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar2 = lVar2 + 0x20;
      } while (uVar5 < uVar3);
    }
    pcVar4 = local_58;
    this = local_60;
    if (local_58 != (char *)0x0) {
      std::__cxx11::string::append((string *)&local_50," (e.g. ");
      std::__cxx11::string::append((string *)&local_50,pcVar4);
      std::__cxx11::string::append((string *)&local_50,")");
    }
  }
  local_78 = token.loc.filename.size_;
  aStack_70.offset = (size_t)token.loc.field_1.field_1.offset;
  local_88 = (char *)auStack_f8;
  pcStack_80 = token.loc.filename.data_;
  Token::to_string_clamp_abi_cxx11_
            ((string *)((long)&token.field_2.literal_.text.field_2 + 8),(Token *)auStack_f8,0x50);
  Error(this,0x11d8a48,(char *)token.field_2._32_8_,local_50);
  if ((undefined1 *)token.field_2._32_8_ != &stack0xffffffffffffff68) {
    operator_delete((void *)token.field_2._32_8_);
  }
  if (local_50 != &expected_str._M_string_length) {
    operator_delete(local_50);
  }
  Token::~Token((Token *)auStack_f8);
  return (Result)Error;
}

Assistant:

Result WastParser::ErrorExpected(const std::vector<std::string>& expected,
                                 const char* example) {
  Token token = Consume();
  std::string expected_str;
  if (!expected.empty()) {
    expected_str = ", expected ";
    for (size_t i = 0; i < expected.size(); ++i) {
      if (i != 0) {
        if (i == expected.size() - 1) {
          expected_str += " or ";
        } else {
          expected_str += ", ";
        }
      }

      expected_str += expected[i];
    }

    if (example) {
      expected_str += " (e.g. ";
      expected_str += example;
      expected_str += ")";
    }
  }

  Error(token.loc, "unexpected token \"%s\"%s.",
        token.to_string_clamp(kMaxErrorTokenLength).c_str(),
        expected_str.c_str());
  return Result::Error;
}